

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void Parser::getFirst(Node *node)

{
  bool bVar1;
  reference pvVar2;
  reference rule;
  reference pvVar3;
  Rule *t;
  iterator __end1;
  iterator __begin1;
  vector<Parser::Rule,_std::allocator<Parser::Rule>_> *__range1;
  Node *node_local;
  
  if (((node->isEnd & 1U) == 0) &&
     (pvVar2 = std::vector<Parser::Mid,_std::allocator<Parser::Mid>_>::operator[]
                         ((vector<Parser::Mid,_std::allocator<Parser::Mid>_> *)mids,(long)node->id),
     (pvVar2->vis & 1U) == 0)) {
    pvVar2 = std::vector<Parser::Mid,_std::allocator<Parser::Mid>_>::operator[]
                       ((vector<Parser::Mid,_std::allocator<Parser::Mid>_> *)mids,(long)node->id);
    pvVar2->vis = true;
    pvVar2 = std::vector<Parser::Mid,_std::allocator<Parser::Mid>_>::operator[]
                       ((vector<Parser::Mid,_std::allocator<Parser::Mid>_> *)mids,(long)node->id);
    __end1 = std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>::begin(&pvVar2->rules);
    t = (Rule *)std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>::end(&pvVar2->rules);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<Parser::Rule_*,_std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>_>
                                       *)&t), bVar1) {
      rule = __gnu_cxx::
             __normal_iterator<Parser::Rule_*,_std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>_>
             ::operator*(&__end1);
      pvVar2 = std::vector<Parser::Mid,_std::allocator<Parser::Mid>_>::operator[]
                         ((vector<Parser::Mid,_std::allocator<Parser::Mid>_> *)mids,(long)node->id);
      pvVar3 = std::vector<Parser::Mid,_std::allocator<Parser::Mid>_>::operator[]
                         ((vector<Parser::Mid,_std::allocator<Parser::Mid>_> *)mids,(long)node->id);
      getFirst(rule,&pvVar2->canNone,&pvVar3->first);
      __gnu_cxx::
      __normal_iterator<Parser::Rule_*,_std::vector<Parser::Rule,_std::allocator<Parser::Rule>_>_>::
      operator++(&__end1);
    }
  }
  return;
}

Assistant:

void getFirst(const Node &node){
        if(node.isEnd) return;
        if(mids[node.id].vis) return;
        mids[node.id].vis = true;
        for(auto &t:mids[node.id].rules){
            getFirst(t,mids[node.id].canNone,mids[node.id].first);
        }
    }